

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

quath tinyusdz::slerp(quath *_a,quath *_b,float t)

{
  quatf *this;
  half hVar1;
  float *pfVar2;
  half *phVar3;
  float fVar4;
  undefined1 local_64 [8];
  quatf _c;
  undefined1 local_44 [8];
  quatf b;
  quatf a;
  float t_local;
  quath *_b_local;
  quath *_a_local;
  quath c;
  
  hVar1 = value::quath::operator[](_a,0);
  fVar4 = value::half_to_float(hVar1);
  this = (quatf *)(b.imag._M_elems + 2);
  pfVar2 = value::quatf::operator[](this,0);
  *pfVar2 = fVar4;
  hVar1 = value::quath::operator[](_a,1);
  fVar4 = value::half_to_float(hVar1);
  pfVar2 = value::quatf::operator[](this,1);
  *pfVar2 = fVar4;
  hVar1 = value::quath::operator[](_a,2);
  fVar4 = value::half_to_float(hVar1);
  pfVar2 = value::quatf::operator[](this,2);
  *pfVar2 = fVar4;
  hVar1 = value::quath::operator[](_a,3);
  fVar4 = value::half_to_float(hVar1);
  pfVar2 = value::quatf::operator[](this,3);
  *pfVar2 = fVar4;
  _c.real._2_2_ = value::quath::operator[](_b,0);
  fVar4 = value::half_to_float(_c.real._2_2_);
  pfVar2 = value::quatf::operator[]((quatf *)local_44,0);
  *pfVar2 = fVar4;
  _c.real._0_2_ = value::quath::operator[](_b,1);
  fVar4 = value::half_to_float(_c.real._0_2_);
  pfVar2 = value::quatf::operator[]((quatf *)local_44,1);
  *pfVar2 = fVar4;
  _c.imag._M_elems[2]._2_2_ = value::quath::operator[](_b,2);
  fVar4 = value::half_to_float(_c.imag._M_elems[2]._2_2_);
  pfVar2 = value::quatf::operator[]((quatf *)local_44,2);
  *pfVar2 = fVar4;
  _c.imag._M_elems[2]._0_2_ = value::quath::operator[](_b,3);
  fVar4 = value::half_to_float(_c.imag._M_elems[2]._0_2_);
  pfVar2 = value::quatf::operator[]((quatf *)local_44,3);
  *pfVar2 = fVar4;
  _local_64 = slerp(this,(quatf *)local_44,t);
  pfVar2 = value::quatf::operator[]((quatf *)local_64,0);
  hVar1 = value::float_to_half_full(*pfVar2);
  phVar3 = value::quath::operator[]((quath *)&_a_local,0);
  phVar3->value = hVar1.value;
  pfVar2 = value::quatf::operator[]((quatf *)local_64,1);
  hVar1 = value::float_to_half_full(*pfVar2);
  phVar3 = value::quath::operator[]((quath *)&_a_local,1);
  phVar3->value = hVar1.value;
  pfVar2 = value::quatf::operator[]((quatf *)local_64,2);
  hVar1 = value::float_to_half_full(*pfVar2);
  phVar3 = value::quath::operator[]((quath *)&_a_local,2);
  phVar3->value = hVar1.value;
  pfVar2 = value::quatf::operator[]((quatf *)local_64,3);
  hVar1 = value::float_to_half_full(*pfVar2);
  phVar3 = value::quath::operator[]((quath *)&_a_local,3);
  phVar3->value = hVar1.value;
  return (quath)_a_local;
}

Assistant:

value::quath slerp(const value::quath &_a, const value::quath &_b, const float t) {
  value::quatf a;
  value::quatf b;

  a[0] = value::half_to_float(_a[0]);
  a[1] = value::half_to_float(_a[1]);
  a[2] = value::half_to_float(_a[2]);
  a[3] = value::half_to_float(_a[3]);

  b[0] = value::half_to_float(_b[0]);
  b[1] = value::half_to_float(_b[1]);
  b[2] = value::half_to_float(_b[2]);
  b[3] = value::half_to_float(_b[3]);

  value::quatf _c = slerp(a, b, t);

  value::quath c;
  c[0] = value::float_to_half_full(_c[0]);
  c[1] = value::float_to_half_full(_c[1]);
  c[2] = value::float_to_half_full(_c[2]);
  c[3] = value::float_to_half_full(_c[3]);

  return c;
}